

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustr.c
# Opt level: O2

void ustr_initChars(UString_conflict *s,char *source,int32_t length,UErrorCode *status)

{
  int32_t len;
  undefined8 in_RAX;
  size_t sVar1;
  ulong uVar2;
  bool bVar3;
  undefined8 uStack_38;
  UChar charToAppend;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  s->fChars = (UChar *)0x0;
  s->fLength = 0;
  s->fCapacity = 0;
  uStack_38 = in_RAX;
  if (length == -1) {
    sVar1 = strlen(source);
    length = (int32_t)sVar1;
  }
  if (0 < length) {
    len = (length * 2 & 0xffffff80U) + 0x80;
    if ((uint)length < 0x80) {
      len = 0x80;
    }
    ustr_resize(s,len,status);
    if (U_ZERO_ERROR < *status) {
      return;
    }
  }
  uVar2 = 0;
  if (0 < length) {
    uVar2 = (ulong)(uint)length;
  }
  while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
    u_charsToUChars_63(source,(UChar *)&charToAppend,1);
    ustr_ucat(s,charToAppend,status);
    source = source + 1;
  }
  return;
}

Assistant:

U_CFUNC void
ustr_initChars(struct UString *s, const char* source, int32_t length, UErrorCode *status)
{
    int i = 0;
    if (U_FAILURE(*status)) return;
    s->fChars = 0;
    s->fLength = s->fCapacity = 0;
    if (length == -1) {
        length = (int32_t)uprv_strlen(source);
    }
    if(s->fCapacity < length) {
      ustr_resize(s, ALLOCATION(length), status);
      if(U_FAILURE(*status)) return;
    }
    for (; i < length; i++)
    {
      UChar charToAppend;
      u_charsToUChars(source+i, &charToAppend, 1);
      ustr_ucat(s, charToAppend, status);
      /*
#if U_CHARSET_FAMILY==U_ASCII_FAMILY
        ustr_ucat(s, (UChar)(uint8_t)(source[i]), status);
#elif U_CHARSET_FAMILY==U_EBCDIC_FAMILY
        ustr_ucat(s, (UChar)asciiFromEbcdic[(uint8_t)(*cs++)], status);
#else
#   error U_CHARSET_FAMILY is not valid
#endif
      */
    }
}